

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O2

void __thiscall sync_test::main(sync_test *this,string *param_1)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  time_t tVar4;
  ostream *poVar5;
  time_t tVar6;
  value *this_00;
  int *piVar7;
  ulong uVar8;
  
  cppcms::application::response();
  uVar3 = cppcms::http::response::out();
  tVar4 = time((time_t *)0x0);
  uVar1 = 0;
  do {
    uVar8 = uVar1;
    if (uVar8 == 10000000) break;
    poVar5 = std::ostream::_M_insert<unsigned_long>(uVar3);
    poVar5 = std::operator<<(poVar5,'\n');
    uVar1 = uVar8 + 1;
  } while (((byte)poVar5[*(long *)(*(long *)poVar5 + -0x18) + 0x20] & 5) == 0);
  tVar6 = time((time_t *)0x0);
  this_00 = (value *)cppcms::application::settings();
  iVar2 = cppcms::json::value::get<int>(this_00,"http.timeout");
  poVar5 = std::operator<<((ostream *)&std::cout,"IO Completed in ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5," seconds, timeout=");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
  std::endl<char,std::char_traits<char>>(poVar5);
  if ((long)(iVar2 * 3) < tVar6 - tVar4) {
    piVar7 = &above_3to;
  }
  else {
    if ((long)(iVar2 * 2) <= tVar6 - tVar4) goto LAB_00109898;
    piVar7 = &below_2to;
  }
  *piVar7 = *piVar7 + 1;
LAB_00109898:
  if (uVar8 < 10000000) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Disconned as expected");
    std::endl<char,std::char_traits<char>>(poVar5);
    sync_bad_count = sync_bad_count + 1;
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Not disconnected!");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		bool bad_found = false;
		std::ostream &out = response().out();
		time_t start = time(0);
		for(unsigned i=0;i<10000000;i++) {
			if(!(out << i << '\n')) {
				bad_found = true;
				break;
			}
		}
		time_t end = time(0);
		int timeout = settings().get<int>("http.timeout");
		std::cout << "IO Completed in " << (end-start) << " seconds, timeout=" << timeout << std::endl;
		if(end - start > 3*timeout)
			above_3to ++;
		else if(end - start < 2*timeout)
			below_2to ++;

		if(bad_found) {
			std::cout << "Disconned as expected" << std::endl;
			sync_bad_count++;
		}
		else {
			std::cout << "Not disconnected!" << std::endl;
		}
	}